

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

unsigned_long __thiscall
tfs::TMatrix<double>::getIndex
          (TMatrix<double> *this,unsigned_long aa,unsigned_long bb,unsigned_long cc)

{
  ulong uVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  unsigned_long index;
  
  uVar1 = in_RCX * in_RDI[4] + in_RDX * *in_RDI + in_RSI;
  if ((ulong)in_RDI[6] <= uVar1) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"getIndex",0x96,
                   "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu",uVar1,
                   in_RDI[6]);
  }
  return uVar1;
}

Assistant:

inline unsigned long getIndex( const unsigned long aa,
                                       const unsigned long bb,
                                       const unsigned long cc ) const {     // Assumes dd == 0
            const unsigned long index = cc * m_ab + bb * m_a + aa;
            if( index >= m_count ) {
                log_error( "Index out of range: %lu/%lu, a = %lu/%lu, b = %lu/%lu, c = %lu/%lu",
                          index, m_count, aa, m_a, bb, m_b, cc, m_c );
            }
            return index;
        }